

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluProgramInterfaceQuery.cpp
# Opt level: O0

void glu::getProgramInterfaceVariableInfo
               (Functions *gl,deUint32 program,deUint32 programInterface,deUint32 index,
               InterfaceVariableInfo *info)

{
  deUint32 dVar1;
  InterfaceVariableInfo *info_local;
  deUint32 index_local;
  deUint32 programInterface_local;
  deUint32 program_local;
  Functions *gl_local;
  
  info->index = index;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92fd);
  info->blockIndex = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92fa);
  info->type = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92fb);
  info->arraySize = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92fc);
  info->offset = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92fe);
  info->arrayStride = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x92ff);
  info->matrixStride = dVar1;
  dVar1 = getProgramResourceUint(gl,program,programInterface,index,0x9300);
  info->isRowMajor = dVar1 != 0;
  if (programInterface == 0x92e1) {
    dVar1 = getProgramResourceUint(gl,program,0x92e1,index,0x9301);
    info->atomicCounterBufferIndex = dVar1;
  }
  if (programInterface == 0x92e5) {
    dVar1 = getProgramResourceUint(gl,program,0x92e5,index,0x930c);
    info->topLevelArraySize = dVar1;
    dVar1 = getProgramResourceUint(gl,program,0x92e5,index,0x930d);
    info->topLevelArrayStride = dVar1;
  }
  getProgramResourceName(gl,program,programInterface,index,&info->name);
  return;
}

Assistant:

void getProgramInterfaceVariableInfo (const glw::Functions& gl, deUint32 program, deUint32 programInterface, deUint32 index, InterfaceVariableInfo& info)
{
	// \todo [2013-08-27 pyry] Batch queries!
	info.index			= index;
	info.blockIndex		= getProgramResourceUint(gl, program, programInterface, index, GL_BLOCK_INDEX);
	info.type			= getProgramResourceUint(gl, program, programInterface, index, GL_TYPE);
	info.arraySize		= getProgramResourceUint(gl, program, programInterface, index, GL_ARRAY_SIZE);
	info.offset			= getProgramResourceUint(gl, program, programInterface, index, GL_OFFSET);
	info.arrayStride	= getProgramResourceUint(gl, program, programInterface, index, GL_ARRAY_STRIDE);
	info.matrixStride	= getProgramResourceUint(gl, program, programInterface, index, GL_MATRIX_STRIDE);
	info.isRowMajor		= getProgramResourceUint(gl, program, programInterface, index, GL_IS_ROW_MAJOR) != GL_FALSE;

	if (programInterface == GL_UNIFORM)
		info.atomicCounterBufferIndex = getProgramResourceUint(gl, program, programInterface, index, GL_ATOMIC_COUNTER_BUFFER_INDEX);

	if (programInterface == GL_BUFFER_VARIABLE)
	{
		info.topLevelArraySize		= getProgramResourceUint(gl, program, programInterface, index, GL_TOP_LEVEL_ARRAY_SIZE);
		info.topLevelArrayStride	= getProgramResourceUint(gl, program, programInterface, index, GL_TOP_LEVEL_ARRAY_STRIDE);
	}

	getProgramResourceName(gl, program, programInterface, index, info.name);
}